

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O0

void ror_6E(void)

{
  ubyte uVar1;
  byte bVar2;
  byte bVar3;
  ubyte oldcar;
  
  uVar1 = carry_f;
  except = '\0';
  bVar2 = getbyte(pc);
  bVar3 = getbyte(pc + 1);
  tempint = (ushort)bVar2 + (ushort)bVar3 * 0x100;
  bVar2 = getbyte(tempint);
  carry_f = bVar2 & 1;
  result_f = (ubyte)((int)(uint)bVar2 >> 1);
  if (uVar1 != '\0') {
    result_f = result_f | 0x80;
  }
  putbyte(result_f,tempint);
  pc = pc + 2;
  return;
}

Assistant:

void ror_6E(void) {
    ubyte oldcar;
    CLE;

    oldcar = carry_f;
    result_f = getbyte(tempint = getbyte(pc) + 0x100 * getbyte(pc + 1));

    carry_f = result_f & 1;
    result_f >>= 1;
    if (oldcar) result_f |= 0x80;

    putbyte(result_f, tempint);
    pc += 2;
}